

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

bool __thiscall
GraphPropagator::coherence_outedges
          (GraphPropagator *this,int node,vector<int,_std::allocator<int>_> *remvd_e)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  Lit LVar5;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  Lit *pLVar6;
  ulong uVar7;
  BoolView *pBVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  edge_id edge;
  long local_58;
  Clause *expl;
  vec<Lit> local_48;
  
  uVar9 = 0;
  local_58 = (ulong)(uint)node << 4;
  do {
    uVar10 = (ulong)uVar9;
    pvVar1 = (this->adj).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pvVar1[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    uVar11 = (long)*(pointer *)
                    ((long)&pvVar1[node].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8) - lVar2 >> 2;
    if (uVar11 <= uVar10) {
LAB_001a3613:
      return uVar11 <= uVar10;
    }
    edge = *(uint *)(lVar2 + uVar10 * 4);
    uVar7 = (ulong)(uint)edge;
    pBVar8 = (this->es).data;
    if (sat.assigns.data[(uint)pBVar8[uVar7].v] != '\0') {
      iVar3 = BoolView::getVal(pBVar8 + uVar7);
      if (iVar3 == 1) {
        if (so.lazy == true) {
          local_48.sz = 0;
          local_48.cap = 0;
          local_48.data = (Lit *)0x0;
          LVar5 = BoolView::getValLit((this->es).data + (uint)edge);
          expl = (Clause *)CONCAT44(expl._4_4_,LVar5.x);
          vec<Lit>::push(&local_48,(Lit *)&expl);
          LVar5 = BoolView::getValLit((BoolView *)
                                      ((long)&(((this->vs).data)->super_Var).super_Branching.
                                              _vptr_Branching + local_58));
          pLVar6 = (Lit *)&expl;
          expl = (Clause *)CONCAT44(expl._4_4_,LVar5.x);
          vec<Lit>::push(&local_48,pLVar6);
          expl = Clause_new<vec<Lit>>(&local_48,SUB81(pLVar6,0));
          *(byte *)expl = *(byte *)expl | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&expl);
          sat.confl = expl;
          free(local_48.data);
        }
        goto LAB_001a3613;
      }
      uVar7 = (ulong)(uint)edge;
      pBVar8 = (this->es).data;
    }
    uVar4 = (uint)uVar7;
    if (sat.assigns.data[(uint)pBVar8[uVar7].v] == '\0') {
      if (so.lazy == true) {
        r._pt = Reason_new((int)pBVar8);
        LVar5 = BoolView::getValLit((BoolView *)
                                    ((long)&(((this->vs).data)->super_Var).super_Branching.
                                            _vptr_Branching + local_58));
        pLVar6 = Clause::operator[](r._pt,1);
        pLVar6->x = LVar5.x;
        pBVar8 = (this->es).data;
        uVar4 = edge;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      BoolView::setVal2(pBVar8 + uVar4,false,(Reason)r);
      std::vector<int,_std::allocator<int>_>::push_back(remvd_e,&edge);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool GraphPropagator::coherence_outedges(int node, std::vector<edge_id>& remvd_e) {
	for (unsigned int i = 0; i < adj[node].size(); i++) {
		const edge_id edge = adj[node][i];
		// Edge with missing an endnode
		if (es[edge].isFixed() && es[edge].getVal() == 1) {
			if (so.lazy) {
				vec<Lit> ps;
				ps.push(es[edge].getValLit());
				ps.push(vs[node].getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		// Edge that must be removed
		if (!es[edge].isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				r = Reason_new(2);
				(*r)[1] = vs[node].getValLit();
			}
			if (GRAPHPROP_DEBUG) {
				std::cout << "COHERENCE (E) " << edge << '\n';
			}
			es[edge].setVal2(false, r);
			remvd_e.push_back(edge);
		}
	}
	return true;
}